

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O3

Fl_Shared_Image * Fl_Shared_Image::get(char *name,int W,int H)

{
  int iVar1;
  Fl_Shared_Image *pFVar2;
  undefined4 extraout_var;
  
  pFVar2 = find(name,W,H);
  if (pFVar2 == (Fl_Shared_Image *)0x0) {
    pFVar2 = find(name,0,0);
    if (pFVar2 == (Fl_Shared_Image *)0x0) {
      pFVar2 = (Fl_Shared_Image *)operator_new(0x48);
      Fl_Shared_Image(pFVar2,name,(Fl_Image *)0x0);
      if (pFVar2->image_ == (Fl_Image *)0x0) {
        (*(pFVar2->super_Fl_Image)._vptr_Fl_Image[1])(pFVar2);
        return (Fl_Shared_Image *)0x0;
      }
      add(pFVar2);
    }
    if ((pFVar2->super_Fl_Image).w_ == W) {
      if (H == 0) {
        return pFVar2;
      }
      if (W == 0) {
        return pFVar2;
      }
      if ((pFVar2->super_Fl_Image).h_ == H) {
        return pFVar2;
      }
    }
    else if (H == 0 || W == 0) {
      return pFVar2;
    }
    iVar1 = (*(pFVar2->super_Fl_Image)._vptr_Fl_Image[2])(pFVar2,(ulong)(uint)W,(ulong)(uint)H);
    pFVar2 = (Fl_Shared_Image *)CONCAT44(extraout_var,iVar1);
    add(pFVar2);
  }
  return pFVar2;
}

Assistant:

Fl_Shared_Image* Fl_Shared_Image::get(const char *name, int W, int H) {
  Fl_Shared_Image	*temp;		// Image

  if ((temp = find(name, W, H)) != NULL) return temp;

  if ((temp = find(name)) == NULL) {
    temp = new Fl_Shared_Image(name);

    if (!temp->image_) {
      delete temp;
      return NULL;
    }

    temp->add();
  }

  if ((temp->w() != W || temp->h() != H) && W && H) {
    temp = (Fl_Shared_Image *)temp->copy(W, H);
    temp->add();
  }

  return temp;
}